

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O1

int DataManager::getNodeType(int index,int *type,Network *nw)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  int iVar4;
  
  *type = 0;
  iVar4 = 0xcd;
  if (-1 < index) {
    iVar1 = Network::count(nw,NODE);
    if (index < iVar1) {
      pNVar3 = Network::node(nw,index);
      uVar2 = (*(pNVar3->super_Element)._vptr_Element[2])(pNVar3);
      if (uVar2 < 3) {
        *type = *(int *)(&DAT_00147158 + (ulong)uVar2 * 4);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int DataManager::getNodeType(int index, int* type, Network* nw)
{
    *type = 0;
    if ( index < 0 || index >= nw->count(Element::NODE) ) return 205;
    switch (nw->node(index)->type())
    {
        case Node::JUNCTION:  *type = EN_JUNCTION;  break;
        case Node::RESERVOIR: *type = EN_RESERVOIR; break;
        case Node::TANK:      *type = EN_TANK;      break;
    }
    return 0;
}